

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O1

CSharedMemoryObjectManager * CorUnix::InternalNew<CorUnix::CSharedMemoryObjectManager>(void)

{
  CSharedMemoryObjectManager *pCVar1;
  
  pCVar1 = (CSharedMemoryObjectManager *)InternalMalloc(0x180);
  if (pCVar1 == (CSharedMemoryObjectManager *)0x0) {
    pCVar1 = (CSharedMemoryObjectManager *)0x0;
  }
  else {
    *(undefined ***)pCVar1 = &PTR_AllocateObject_001887e0;
    pCVar1->m_fListLockInitialized = false;
    (pCVar1->m_HandleManager)._vptr_CSimpleHandleManager =
         (_func_int **)&PTR__CSimpleHandleManager_00188590;
    (pCVar1->m_HandleManager).m_hiFreeListStart = 0xffffffffffffffff;
    (pCVar1->m_HandleManager).m_hiFreeListEnd = 0xffffffffffffffff;
    (pCVar1->m_HandleManager).m_dwTableSize = 0;
    (pCVar1->m_HandleManager).m_dwTableGrowthRate = 0x400;
    (pCVar1->m_HandleManager).m_rghteHandleTable = (HANDLE_TABLE_ENTRY *)0x0;
    (pCVar1->m_HandleManager).m_fLockInitialized = false;
  }
  return pCVar1;
}

Assistant:

T* InternalNew()
    {
        INTERNAL_NEW_COMMON();
        return new (pMem) T();
    }